

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_joystick.c
# Opt level: O0

void openJoystickDevice(char *path)

{
  int iVar1;
  char *pcVar2;
  float *pfVar3;
  uchar *puVar4;
  int local_124;
  int local_120;
  int version;
  int fd;
  int joy;
  char name [256];
  char buttonCount;
  char axisCount;
  char *path_local;
  
  version = 0;
  while( true ) {
    if (0xf < version) {
      version = 0;
      while ((version < 0x10 && (_glfw.linux_js.js[version].present != 0))) {
        version = version + 1;
      }
      if ((version < 0x10) && (local_120 = open(path,0x800), local_120 != -1)) {
        _glfw.linux_js.js[version].fd = local_120;
        ioctl(local_120,0x80046a01,&local_124);
        if (local_124 < 0x10000) {
          close(local_120);
        }
        else {
          iVar1 = ioctl(local_120,0x81006a13,&fd);
          if (iVar1 < 0) {
            XRRGetOutputInfo(&fd,"Unknown",0x100);
          }
          pcVar2 = strdup((char *)&fd);
          _glfw.linux_js.js[version].name = pcVar2;
          pcVar2 = strdup(path);
          _glfw.linux_js.js[version].path = pcVar2;
          ioctl(local_120,0x80016a11,name + 0xff);
          _glfw.linux_js.js[version].axisCount = (int)name[0xff];
          ioctl(local_120,0x80016a12,name + 0xfe);
          _glfw.linux_js.js[version].buttonCount = (int)name[0xfe];
          pfVar3 = (float *)calloc((long)name[0xff],4);
          _glfw.linux_js.js[version].axes = pfVar3;
          puVar4 = (uchar *)calloc((long)name[0xfe],1);
          _glfw.linux_js.js[version].buttons = puVar4;
          _glfw.linux_js.js[version].present = 1;
        }
      }
      return;
    }
    if ((_glfw.linux_js.js[version].present != 0) &&
       (iVar1 = strcmp(_glfw.linux_js.js[version].path,path), iVar1 == 0)) break;
    version = version + 1;
  }
  return;
}

Assistant:

static void openJoystickDevice(const char* path)
{
#if defined(__linux__)
    char axisCount, buttonCount;
    char name[256];
    int joy, fd, version;

    for (joy = GLFW_JOYSTICK_1;  joy <= GLFW_JOYSTICK_LAST;  joy++)
    {
        if (!_glfw.linux_js.js[joy].present)
            continue;

        if (strcmp(_glfw.linux_js.js[joy].path, path) == 0)
            return;
    }

    for (joy = GLFW_JOYSTICK_1;  joy <= GLFW_JOYSTICK_LAST;  joy++)
    {
        if (!_glfw.linux_js.js[joy].present)
            break;
    }

    if (joy > GLFW_JOYSTICK_LAST)
        return;

    fd = open(path, O_RDONLY | O_NONBLOCK);
    if (fd == -1)
        return;

    _glfw.linux_js.js[joy].fd = fd;

    // Verify that the joystick driver version is at least 1.0
    ioctl(fd, JSIOCGVERSION, &version);
    if (version < 0x010000)
    {
        // It's an old 0.x interface (we don't support it)
        close(fd);
        return;
    }

    if (ioctl(fd, JSIOCGNAME(sizeof(name)), name) < 0)
        strncpy(name, "Unknown", sizeof(name));

    _glfw.linux_js.js[joy].name = strdup(name);
    _glfw.linux_js.js[joy].path = strdup(path);

    ioctl(fd, JSIOCGAXES, &axisCount);
    _glfw.linux_js.js[joy].axisCount = (int) axisCount;

    ioctl(fd, JSIOCGBUTTONS, &buttonCount);
    _glfw.linux_js.js[joy].buttonCount = (int) buttonCount;

    _glfw.linux_js.js[joy].axes = calloc(axisCount, sizeof(float));
    _glfw.linux_js.js[joy].buttons = calloc(buttonCount, 1);

    _glfw.linux_js.js[joy].present = GL_TRUE;
#endif // __linux__
}